

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::WriteEthernetPhyReset(FpgaIO *this,uint chan)

{
  bool bVar1;
  undefined4 local_18;
  quadlet_t write_data;
  uint chan_local;
  FpgaIO *this_local;
  
  local_18 = 0x4000000;
  if ((chan & 1) != 0) {
    local_18 = 0x4000080;
  }
  if ((chan & 2) != 0) {
    local_18 = local_18 | 0x8000;
  }
  bVar1 = WriteEthernetControl(this,local_18);
  return bVar1;
}

Assistant:

bool FpgaIO::WriteEthernetPhyReset(unsigned int chan)
{
    quadlet_t write_data = ETH_CTRL_RESET_PHY;
    if (chan&1)
        write_data |= ETH_PORT_CTRL_RESET_PHY;
    if (chan&2)
        write_data |= (ETH_PORT_CTRL_RESET_PHY<<8);
    return WriteEthernetControl(write_data);
}